

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_htmlmodelserialiser.cpp
# Opt level: O0

void HtmlModelSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  void *pvVar1;
  bool bVar2;
  void *_v_1;
  HtmlModelSerialiser *_t_1;
  void *_v;
  HtmlModelSerialiser *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == ReadProperty) {
    pvVar1 = *_a;
    if (_id == 0) {
      bVar2 = printStartDocument((HtmlModelSerialiser *)_o);
      *(bool *)pvVar1 = bVar2;
    }
  }
  else if ((_c == WriteProperty) && (_id == 0)) {
    setPrintStartDocument((HtmlModelSerialiser *)_o,(bool)(**_a & 1));
  }
  return;
}

Assistant:

void HtmlModelSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<HtmlModelSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< bool*>(_v) = _t->printStartDocument(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<HtmlModelSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setPrintStartDocument(*reinterpret_cast< bool*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}